

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html_display_driver.cpp
# Opt level: O3

void __thiscall HtmlDisplayDriver::display(HtmlDisplayDriver *this,Document *doc,ostream *output)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  undefined4 uVar8;
  int iVar9;
  long lVar10;
  long *plVar11;
  long *plVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  ostream *poVar17;
  ulong uVar18;
  char *pcVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  HtmlDisplayDriver *local_38;
  
  cVar1 = (char)output;
  local_38 = this;
  if (this->field_0x8 == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>(output,"<!doctype html>",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(output,"<html lang=\"fr\">",0x10);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(output,"<head>",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(output,"<meta charset=\"utf-8\">",0x16);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (output,"<title>mdl generated HTML page</title>",0x26);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(output,"</head>",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(output,"<body>",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  lVar10 = Document::size();
  if (lVar10 != 0) {
    uVar20 = 0;
    bVar5 = false;
    bVar6 = false;
    bVar3 = false;
    bVar4 = false;
    do {
      plVar11 = (long *)Document::operator[]((ulong)doc);
      uVar8 = (**(code **)(*plVar11 + 8))(plVar11);
      switch(uVar8) {
      case 1:
        pcVar19 = "<h1>";
        goto LAB_00121e21;
      case 2:
        pcVar19 = "<h2>";
        goto LAB_00121e21;
      case 3:
        pcVar19 = "<h3>";
LAB_00121e21:
        std::__ostream_insert<char,std::char_traits<char>>(output,pcVar19,4);
        break;
      default:
        std::__ostream_insert<char,std::char_traits<char>>(output,"<p>",3);
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        break;
      case 7:
        if (!bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>(output,"<ol>",4);
          std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
        }
        std::__ostream_insert<char,std::char_traits<char>>(output,"<li>",4);
        bVar5 = true;
        break;
      case 8:
        if (!bVar6) {
          std::__ostream_insert<char,std::char_traits<char>>(output,"<ul>",4);
          std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
        }
        std::__ostream_insert<char,std::char_traits<char>>(output,"<li>",4);
        bVar6 = true;
        break;
      case 10:
        if (!bVar3) {
          std::__ostream_insert<char,std::char_traits<char>>(output,"<blockquote>",0xc);
          std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
        }
        bVar3 = true;
        break;
      case 0xb:
        if (!bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>(output,"<code>",6);
          std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
          std::ostream::put(cVar1);
          std::ostream::flush();
        }
        bVar4 = true;
      }
      lVar10 = Paragraph::size();
      if (lVar10 != 0) {
        uVar18 = 0;
        local_48 = plVar11;
        do {
          plVar12 = (long *)Paragraph::operator[]((ulong)plVar11);
          bVar2 = true;
          if (plVar12 == (long *)0x0) {
            bVar21 = true;
            bVar22 = true;
            lVar10 = 0;
          }
          else {
            lVar13 = __dynamic_cast(plVar12,&LineElement::typeinfo,&BoldLineElement::typeinfo,0);
            bVar21 = lVar13 == 0;
            lVar14 = __dynamic_cast(plVar12,&LineElement::typeinfo,&ItalicLineElement::typeinfo);
            lVar15 = __dynamic_cast(plVar12,&LineElement::typeinfo,&CodeLineElement::typeinfo);
            bVar22 = lVar15 == 0;
            lVar10 = __dynamic_cast(plVar12,&LineElement::typeinfo,&UrlLineElement::typeinfo);
            plVar11 = local_48;
            local_40 = lVar10;
            if (lVar14 == 0) {
              if (lVar13 == 0) {
                bVar2 = true;
                if ((lVar15 == 0) || (iVar9 = (**(code **)(*local_48 + 8))(local_48), iVar9 == 0xb))
                {
                  if (lVar10 == 0) {
                    lVar10 = 0;
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>(output,"<a href=\"",9);
                    UrlLineElement::url_abi_cxx11_();
                    poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                        (output,(char *)local_68,local_60);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\">",2);
                    if (local_68 != local_58) {
                      operator_delete(local_68,local_58[0] + 1);
                    }
                  }
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>(output,"<code>",6);
                  bVar22 = false;
                }
                bVar21 = true;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>(output,"<b>",3);
                bVar21 = false;
                bVar2 = true;
                plVar11 = local_48;
                lVar10 = local_40;
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>(output,"<i>",3);
              bVar2 = false;
              plVar11 = local_48;
              lVar10 = local_40;
            }
          }
          (**(code **)(*plVar12 + 0x10))(&local_68,plVar12);
          std::__ostream_insert<char,std::char_traits<char>>(output,(char *)local_68,local_60);
          if (local_68 != local_58) {
            operator_delete(local_68,local_58[0] + 1);
          }
          if (lVar10 == 0) {
            if (!bVar21) {
              lVar10 = 4;
              pcVar19 = "</b>";
              goto LAB_001220a5;
            }
            if (!bVar2) {
              lVar10 = 4;
              pcVar19 = "</i>";
              goto LAB_001220a5;
            }
            if ((!bVar22) && (iVar9 = (**(code **)(*plVar11 + 8))(plVar11), iVar9 != 0xb)) {
              lVar10 = 7;
              pcVar19 = "</code>";
              goto LAB_001220a5;
            }
          }
          else {
            lVar10 = 4;
            pcVar19 = "</a>";
LAB_001220a5:
            std::__ostream_insert<char,std::char_traits<char>>(output,pcVar19,lVar10);
          }
          uVar18 = uVar18 + 1;
          uVar16 = Paragraph::size();
        } while (uVar18 < uVar16);
      }
      uVar8 = (**(code **)(*plVar11 + 8))(plVar11);
      switch(uVar8) {
      case 1:
        lVar10 = 5;
        pcVar19 = "</h1>";
        break;
      case 2:
        lVar10 = 5;
        pcVar19 = "</h2>";
        break;
      case 3:
        lVar10 = 5;
        pcVar19 = "</h3>";
        break;
      default:
        lVar10 = 4;
        pcVar19 = "</p>";
        break;
      case 7:
        std::__ostream_insert<char,std::char_traits<char>>(output,"</li>",5);
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        cVar7 = Paragraph::last();
        if (cVar7 == '\0') goto LAB_00122349;
        std::__ostream_insert<char,std::char_traits<char>>(output,"</ol>",5);
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        poVar17 = (ostream *)std::ostream::flush();
        bVar5 = false;
        goto LAB_0012231f;
      case 8:
        std::__ostream_insert<char,std::char_traits<char>>(output,"</li>",5);
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        cVar7 = Paragraph::last();
        if (cVar7 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(output,"</ul>",5);
          std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
          std::ostream::put(cVar1);
          poVar17 = (ostream *)std::ostream::flush();
          bVar6 = false;
          goto LAB_0012231f;
        }
        goto LAB_00122349;
      case 10:
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        cVar7 = Paragraph::last();
        if (cVar7 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(output,"</blockquote>",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
          std::ostream::put(cVar1);
          poVar17 = (ostream *)std::ostream::flush();
          bVar3 = false;
          goto LAB_0012231f;
        }
        goto LAB_00122349;
      case 0xb:
        std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
        std::ostream::put(cVar1);
        std::ostream::flush();
        cVar7 = Paragraph::last();
        if (cVar7 != '\0') {
          std::__ostream_insert<char,std::char_traits<char>>(output,"</code>",7);
          std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
          std::ostream::put(cVar1);
          poVar17 = (ostream *)std::ostream::flush();
          bVar4 = false;
          goto LAB_0012231f;
        }
        goto LAB_00122349;
      }
      std::__ostream_insert<char,std::char_traits<char>>(output,pcVar19,lVar10);
      poVar17 = output;
LAB_0012231f:
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar17 + -0x18) + (char)poVar17);
      std::ostream::put((char)poVar17);
      std::ostream::flush();
LAB_00122349:
      uVar20 = uVar20 + 1;
      uVar18 = Document::size();
    } while (uVar20 < uVar18);
  }
  if (local_38->field_0x8 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(output,"</body>",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(output,"</html>",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)output + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  return;
}

Assistant:

void HtmlDisplayDriver::display(Document *doc, ostream & output) {
	Paragraph *p = nullptr;
	LineElement *l = nullptr;

	BoldLineElement *bold_le(nullptr);
	ItalicLineElement *italic_le(nullptr);
	CodeLineElement *code_le(nullptr);
	UrlLineElement *url_le(nullptr);

	bool is_verbatim(false), 
		 is_quotation(false),
		 is_ulist(false),
		 is_olist(false);

	if (_standalone) {
		output << "<!doctype html>" << endl;
		output << "<html lang=\"fr\">" << endl;
		output << "<head>" << endl;
		output << "<meta charset=\"utf-8\">" << endl;
		output << "<title>mdl generated HTML page</title>" << endl;
		output << "</head>" << endl;
		output << "<body>" << endl;
	}

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];

		switch (p->level()) {
			case Paragraph::Level::Title1:
				output << "<h1>";
				break;
			case Paragraph::Level::Title2:
				output << "<h2>";
				break;
			case Paragraph::Level::Title3:
				output << "<h3>";
				break;
			case Paragraph::Level::Code:
				if (!is_verbatim) {
					output << "<code>" << endl;
					is_verbatim = true;
				}
				break;
			case Paragraph::Level::UList1:
				if (!is_ulist) {
					output << "<ul>" << endl;
					is_ulist = true;
				}
				output << "<li>";
				break;
			case Paragraph::Level::OList1:
				if (!is_olist) {
					output << "<ol>" << endl;
					is_olist = true;
				}
				output << "<li>";
				break;
			case Paragraph::Level::Quote:
				if (!is_quotation) {
					output << "<blockquote>" << endl;
					is_quotation = true;
				}
				break;
			default:
				output << "<p>" << endl;
				break;
		}

		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];

			bold_le = dynamic_cast<BoldLineElement*>(l);
			italic_le = dynamic_cast<ItalicLineElement*>(l);
			code_le = dynamic_cast<CodeLineElement*>(l);
			url_le = dynamic_cast<UrlLineElement*>(l);

			if (italic_le) {
				output << "<i>";
			} else if (bold_le) {
				output << "<b>";
			} else if (code_le and p->level() != Paragraph::Level::Code) {
				output << "<code>";
			} else if (url_le) {
				output << "<a href=\"" << url_le->url() << "\">";
			}

			output << l->content();

			if (url_le) {
				output << "</a>";
			} else if (bold_le) {
				output << "</b>";
			} else if (italic_le) {
				output << "</i>";
			} else if (code_le and p->level() != Paragraph::Level::Code) {
				output << "</code>";
			}
		}
		
		switch (p->level()) {
			case Paragraph::Level::Code:
				output << endl;
				if (p->last()) {
					output << "</code>" << endl << endl;
					is_verbatim = false;
				}
				break;
			case Paragraph::Level::Quote:
				output << endl;
				if (p->last()) {
					output << "</blockquote>" << endl << endl;
					is_quotation = false;
				}
				break;
			case Paragraph::Level::UList1:
				output << "</li>" << endl;
				if (p->last()) {
					output << "</ul>" << endl << endl;
					is_ulist = false;
				}
				break;
			case Paragraph::Level::OList1:
				output << "</li>" << endl;
				if (p->last()) {
					output << "</ol>" << endl << endl;
					is_olist = false;
				}
				break;
			case Paragraph::Level::Title1:
				output << "</h1>" << endl;
				break;
			case Paragraph::Level::Title2:
				output << "</h2>" << endl;
				break;
			case Paragraph::Level::Title3:
				output << "</h3>" << endl;
				break;
			default:
				output << "</p>" << endl;
				break;
		}
	}
	if (_standalone) {
		output << "</body>" << endl;
		output << "</html>" << endl;
	}
}